

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeStateCheck(AsyncifyBuilder *this,State value)

{
  Expression *pEVar1;
  Const *pCVar2;
  Binary *this_00;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  undefined8 local_38;
  uintptr_t uStack_30;
  
  local_38 = wasm::(anonymous_namespace)::ASYNCIFY_STATE;
  uStack_30 = DAT_010b1908;
  pEVar1 = (Expression *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x20,8);
  pEVar1->_id = GlobalGetId;
  *(undefined8 *)(pEVar1 + 1) = local_38;
  pEVar1[1].type.id = uStack_30;
  (pEVar1->type).id = 2;
  local_40 = 2;
  local_50.i32 = value;
  pCVar2 = Builder::makeConst(&this->super_Builder,(Literal *)&local_50.func);
  this_00 = (Binary *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = EqInt32;
  this_00->left = pEVar1;
  this_00->right = (Expression *)pCVar2;
  Binary::finalize(this_00);
  Literal::~Literal((Literal *)&local_50.func);
  return (Expression *)this_00;
}

Assistant:

Expression* makeStateCheck(State value) {
    return makeBinary(EqInt32,
                      makeGlobalGet(ASYNCIFY_STATE, Type::i32),
                      makeConst(Literal(int32_t(value))));
  }